

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *this_00;
  pointer pbVar2;
  __type _Var3;
  bool bVar4;
  string *__lhs;
  cmExtraCodeLiteGenerator *this_01;
  _Base_ptr p_Var5;
  string *it;
  pointer value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProjectNames;
  string workspaceFileName;
  string workspaceProjectName;
  cmXMLWriter xml;
  string workspaceOutputDir;
  string workspaceSourcePath;
  cmGeneratedFileStream fout;
  allocator<char> local_391;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  cmXMLWriter local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  cmExtraCodeLiteGenerator *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  cmGeneratedFileStream local_278;
  
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_string_length = 0;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  this_01 = (cmExtraCodeLiteGenerator *)local_288;
  local_290 = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_350.field_2._M_local_buf[0] = '\0';
  local_288[0] = 0;
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var5 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_370 = &this->ConfigName;
  local_298 = this_01;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
LAB_00226a6e:
      cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_350,false,None);
      cmXMLWriter::cmXMLWriter(&local_310,(ostream *)&local_278,0);
      cmXMLWriter::StartDocument(&local_310,"utf-8");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"CodeLite_Workspace",(allocator<char> *)&local_368);
      cmXMLWriter::StartElement(&local_310,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      cmXMLWriter::Attribute<std::__cxx11::string>(&local_310,"Name",&local_330);
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"CMAKE_CODELITE_USE_TARGETS",(allocator<char> *)&local_368);
      bVar4 = cmGlobalGenerator::GlobalSettingIsOn(pcVar1,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar4) {
        CreateProjectsByTarget_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_390,this,&local_310);
      }
      else {
        CreateProjectsByProjectMaps_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_390,this,&local_310);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_368,&local_390);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_390);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"BuildMatrix",&local_391);
      cmXMLWriter::StartElement(&local_310,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"WorkspaceConfiguration",&local_391);
      cmXMLWriter::StartElement(&local_310,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      cmXMLWriter::Attribute<std::__cxx11::string>(&local_310,"Name",local_370);
      cmXMLWriter::Attribute<char[4]>(&local_310,"Selected",(char (*) [4])"yes");
      pbVar2 = local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value = local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; value != pbVar2; value = value + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_390,"Project",&local_391);
        cmXMLWriter::StartElement(&local_310,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        cmXMLWriter::Attribute<std::__cxx11::string>(&local_310,"Name",value);
        cmXMLWriter::Attribute<std::__cxx11::string>(&local_310,"ConfigName",local_370);
        cmXMLWriter::EndElement(&local_310);
      }
      cmXMLWriter::EndElement(&local_310);
      cmXMLWriter::EndElement(&local_310);
      cmXMLWriter::EndElement(&local_310);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_368);
      cmXMLWriter::~cmXMLWriter(&local_310);
      cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_330);
      return;
    }
    this_00 = (cmLocalGenerator *)**(undefined8 **)(p_Var5 + 2);
    GetConfigurationName_abi_cxx11_((string *)&local_278,this_01,this_00->Makefile);
    std::__cxx11::string::operator=((string *)local_370,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    __lhs = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    this_01 = (cmExtraCodeLiteGenerator *)cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
    _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_01);
    if (_Var3) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      cmLocalGenerator::GetProjectName_abi_cxx11_((string *)&local_278,this_00);
      std::__cxx11::string::operator=((string *)&local_330,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      cmLocalGenerator::GetSourceDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&local_298);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278
                     ,&local_2b8,"/");
      std::__cxx11::string::operator=((string *)&local_350,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278
                     ,&local_330,".workspace");
      std::__cxx11::string::append((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_278);
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      std::__cxx11::string::_M_assign((string *)&this->WorkspacePath);
      goto LAB_00226a6e;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;

  const std::map<std::string, std::vector<cmLocalGenerator*>>& projectMap =
    this->GlobalGenerator->GetProjectMap();

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  // root makefile
  for (auto const& it : projectMap) {
    cmLocalGenerator* lg = it.second[0];
    const cmMakefile* mf = lg->GetMakefile();
    this->ConfigName = GetConfigurationName(mf);

    if (lg->GetCurrentBinaryDirectory() == lg->GetBinaryDirectory()) {
      workspaceOutputDir = lg->GetCurrentBinaryDirectory();
      workspaceProjectName = lg->GetProjectName();
      workspaceSourcePath = lg->GetSourceDirectory();
      workspaceFileName = workspaceOutputDir + "/";
      workspaceFileName += workspaceProjectName + ".workspace";
      this->WorkspacePath = lg->GetCurrentBinaryDirectory();
      break;
    }
  }

  cmGeneratedFileStream fout(workspaceFileName);
  cmXMLWriter xml(fout);

  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Workspace");
  xml.Attribute("Name", workspaceProjectName);

  bool const targetsAreProjects =
    this->GlobalGenerator->GlobalSettingIsOn("CMAKE_CODELITE_USE_TARGETS");

  std::vector<std::string> ProjectNames;
  if (targetsAreProjects) {
    ProjectNames = CreateProjectsByTarget(&xml);
  } else {
    ProjectNames = CreateProjectsByProjectMaps(&xml);
  }

  xml.StartElement("BuildMatrix");
  xml.StartElement("WorkspaceConfiguration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("Selected", "yes");

  for (std::string const& it : ProjectNames) {
    xml.StartElement("Project");
    xml.Attribute("Name", it);
    xml.Attribute("ConfigName", this->ConfigName);
    xml.EndElement();
  }

  xml.EndElement(); // WorkspaceConfiguration
  xml.EndElement(); // BuildMatrix
  xml.EndElement(); // CodeLite_Workspace
}